

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

GetMnemonicWordlistResponseStruct *
cfd::js::api::HDWalletStructApi::GetMnemonicWordlist
          (GetMnemonicWordlistResponseStruct *__return_storage_ptr__,
          GetMnemonicWordlistRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&)>
  local_f0;
  GetMnemonicWordlistResponseStruct local_d0;
  
  GetMnemonicWordlistResponseStruct::GetMnemonicWordlistResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:40:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::GetMnemonicWordlistResponseStruct_(const_cfd::js::api::GetMnemonicWordlistRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:40:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f0,"GetMnemonicWordlist",&local_119);
  ExecuteStructApi<cfd::js::api::GetMnemonicWordlistRequestStruct,cfd::js::api::GetMnemonicWordlistResponseStruct>
            (&local_d0,(api *)request,(GetMnemonicWordlistRequestStruct *)&local_118,&local_f0,in_R8
            );
  GetMnemonicWordlistResponseStruct::operator=(__return_storage_ptr__,&local_d0);
  GetMnemonicWordlistResponseStruct::~GetMnemonicWordlistResponseStruct(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

GetMnemonicWordlistResponseStruct HDWalletStructApi::GetMnemonicWordlist(
    const GetMnemonicWordlistRequestStruct& request) {
  auto call_func = [](const GetMnemonicWordlistRequestStruct& request)
      -> GetMnemonicWordlistResponseStruct {
    GetMnemonicWordlistResponseStruct response;
    // check language is support
    std::string language = request.language;

    // get bip39 wordlist
    HDWalletApi api;
    std::vector<std::string> wordlist = api.GetMnemonicWordlist(language);

    response.wordlist = wordlist;
    return response;
  };

  GetMnemonicWordlistResponseStruct result;
  result = ExecuteStructApi<
      GetMnemonicWordlistRequestStruct, GetMnemonicWordlistResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}